

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableMultiplicationGeneralizationImpl.hpp
# Opt level: O0

VariableRegion * __thiscall
Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion::meet
          (VariableRegion *this,VariableRegion *rhs)

{
  bool bVar1;
  Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *in_RSI;
  Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *in_RDI;
  VariableRegion *lhs;
  VariableRegion *in_stack_ffffffffffffff88;
  VariableRegion *in_stack_ffffffffffffff90;
  Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *this_00;
  Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *in_stack_ffffffffffffffc8;
  VariableRegion *in_stack_ffffffffffffffd0;
  Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *l;
  
  l = in_RDI;
  bVar1 = isUninit((VariableRegion *)0x73ffd9);
  if (bVar1) {
    VariableRegion(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  else {
    bVar1 = isUninit((VariableRegion *)0x73fffd);
    if (bVar1) {
      VariableRegion(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    else {
      unwrap((VariableRegion *)0x74001e);
      unwrap((VariableRegion *)0x74002c);
      this_00 = (Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *)&stack0xffffffffffffffc0;
      intersectSortedStack<Inferences::AnyNumber<Kernel::MonomFactor>>(l,in_RSI);
      VariableRegion(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::~Stack(this_00);
    }
  }
  return (VariableRegion *)in_RDI;
}

Assistant:

VariableRegion meet(VariableRegion rhs) 
  {
    auto& lhs = *this;
    if (lhs.isUninit()) return VariableRegion(std::move(rhs));
    if (rhs.isUninit()) return VariableRegion(std::move(lhs));
    return VariableRegion(intersectSortedStack(std::move(lhs.unwrap()), std::move(rhs.unwrap())));
  }